

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void anon_unknown.dwarf_f89de::ClearLoadStoreInfo
               (VmModule *module,VariableData *container,uint storeOffset,uint storeSize)

{
  SmallArray<VmModule::LoadStoreInfo,_32U> *this;
  VmConstant *pVVar1;
  bool bVar2;
  LoadStoreInfo *pLVar3;
  LoadStoreInfo *pLVar4;
  long lVar5;
  uint uVar6;
  uint index;
  byte bVar7;
  
  bVar7 = 0;
  if (storeSize == 0) {
    __assert_fail("storeSize != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x565,
                  "void (anonymous namespace)::ClearLoadStoreInfo(VmModule *, VariableData *, unsigned int, unsigned int)"
                 );
  }
  this = &module->loadStoreInfo;
  uVar6 = (storeOffset + storeSize) - 1;
  index = 0;
  do {
    while( true ) {
      if ((module->loadStoreInfo).count <= index) {
        return;
      }
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](this,index);
      pVVar1 = pLVar3->loadAddress;
      if (pVVar1 == (VmConstant *)0x0) break;
      if (pLVar3->accessSize == 0) {
        __assert_fail("otherSize != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x571,
                      "void (anonymous namespace)::ClearLoadStoreInfo(VmModule *, VariableData *, unsigned int, unsigned int)"
                     );
      }
      if ((uVar6 < (uint)pVVar1->iValue || pVVar1->container != container) ||
         ((pLVar3->accessSize + pVVar1->iValue) - 1 < storeOffset)) break;
LAB_001920c2:
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::back(this);
      pLVar4 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](this,index);
      for (lVar5 = 0x52; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined1 *)&pLVar4->loadInst = *(undefined1 *)&pLVar3->loadInst;
        pLVar3 = (LoadStoreInfo *)((long)pLVar3 + (ulong)bVar7 * -2 + 1);
        pLVar4 = (LoadStoreInfo *)((long)pLVar4 + (ulong)bVar7 * -2 + 1);
      }
      SmallArray<VmModule::LoadStoreInfo,_32U>::pop_back(this);
    }
    pVVar1 = pLVar3->storeAddress;
    if (pVVar1 != (VmConstant *)0x0) {
      if (pLVar3->accessSize == 0) {
        __assert_fail("otherSize != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x582,
                      "void (anonymous namespace)::ClearLoadStoreInfo(VmModule *, VariableData *, unsigned int, unsigned int)"
                     );
      }
      if (((uint)pVVar1->iValue <= uVar6 && pVVar1->container == container) &&
         (storeOffset <= (pLVar3->accessSize + pVVar1->iValue) - 1)) goto LAB_001920c2;
    }
    if (pLVar3->storePointer != (VmValue *)0x0 || pLVar3->loadPointer != (VmValue *)0x0) {
      bVar2 = HasAddressTaken(container);
      if (bVar2) goto LAB_001920c2;
    }
    index = index + 1;
  } while( true );
}

Assistant:

void ClearLoadStoreInfo(VmModule *module, VariableData *container, unsigned storeOffset, unsigned storeSize)
	{
		assert(storeSize != 0);

		for(unsigned i = 0; i < module->loadStoreInfo.size();)
		{
			VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

			// Check load region intersection
			if(el.loadAddress)
			{
				unsigned otherOffset = unsigned(el.loadAddress->iValue);
				unsigned otherSize = el.accessSize;

				assert(otherSize != 0);

				// (a+aw >= b) && (a <= b+bw)
				if(container == el.loadAddress->container && storeOffset + storeSize - 1 >= otherOffset && storeOffset <= otherOffset + otherSize - 1)
				{
					module->loadStoreInfo[i] = module->loadStoreInfo.back();
					module->loadStoreInfo.pop_back();
					continue;
				}
			}

			// Check store region intersection
			if(el.storeAddress)
			{
				unsigned otherOffset = unsigned(el.storeAddress->iValue);
				unsigned otherSize = el.accessSize;

				assert(otherSize != 0);

				// (a+aw >= b) && (a <= b+bw)
				if(container == el.storeAddress->container && storeOffset + storeSize - 1 >= otherOffset && storeOffset <= otherOffset + otherSize - 1)
				{
					module->loadStoreInfo[i] = module->loadStoreInfo.back();
					module->loadStoreInfo.pop_back();
					continue;
				}
			}

			// Any opaque pointer might be clobbered
			if(el.loadPointer || el.storePointer)
			{
				// Unless it's impossible to have an opaque pointer to this container
				if(!HasAddressTaken(container))
				{
					i++;
					continue;
				}

				module->loadStoreInfo[i] = module->loadStoreInfo.back();
				module->loadStoreInfo.pop_back();
				continue;
			}

			i++;
		}
	}